

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ref.c
# Opt level: O2

void connect_and_write(uv_connect_t *req,int status)

{
  undefined8 uVar1;
  char *__format;
  char *pcVar2;
  char *pcVar3;
  uv_connect_t *puVar4;
  int64_t eval_b;
  int64_t eval_a;
  uv_buf_t buf;
  
  buf = uv_buf_init(buffer,0x7fff);
  if (req == &connect_req) {
    req = (uv_connect_t *)(long)status;
    if (req == (uv_connect_t *)0x0) {
      uv_write(&write_req,connect_req.handle,&buf,1,write_cb);
      connect_cb_called = connect_cb_called + 1;
      return;
    }
    __format = "Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n";
    pcVar2 = "status";
    uVar1 = 0x57;
    puVar4 = (uv_connect_t *)0x0;
    pcVar3 = "0";
  }
  else {
    __format = "Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n";
    pcVar2 = "req";
    uVar1 = 0x56;
    puVar4 = &connect_req;
    pcVar3 = "&connect_req";
  }
  fprintf(_stderr,__format,
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ref.c"
          ,uVar1,pcVar2,"==",pcVar3,req,"==",puVar4);
  abort();
}

Assistant:

static void connect_and_write(uv_connect_t* req, int status) {
  uv_buf_t buf = uv_buf_init(buffer, sizeof buffer);
  ASSERT_PTR_EQ(req, &connect_req);
  ASSERT_OK(status);
  uv_write(&write_req, req->handle, &buf, 1, write_cb);
  connect_cb_called++;
}